

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b)

{
  reference pcVar1;
  AlphaNum *pAVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  LogMessage *pLVar6;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  char *local_d0;
  char *out;
  reference local_c0;
  char *begin;
  size_type old_size;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  AlphaNum *local_20;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result_local;
  
  local_20 = b;
  b_local = a;
  a_local = (AlphaNum *)result;
  pcVar3 = strings::AlphaNum::data(a);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  local_59 = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62b);
    local_59 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(local_6d,pLVar6);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  pcVar3 = strings::AlphaNum::data(local_20);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  old_size._7_1_ = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62c);
    old_size._7_1_ = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_a8,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&old_size + 6),pLVar6);
  }
  if ((old_size._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a8);
  }
  begin = (char *)std::__cxx11::string::size();
  pAVar2 = a_local;
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(local_20);
  std::__cxx11::string::resize((ulong)pAVar2);
  out = (char *)std::__cxx11::string::begin();
  local_c0 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar3 = Append2(local_c0 + (long)begin,b_local,local_20);
  pcVar1 = local_c0;
  local_d0 = pcVar3;
  lVar4 = std::__cxx11::string::size();
  local_109 = 0;
  if (pcVar3 != pcVar1 + lVar4) {
    internal::LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x631);
    local_109 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_108,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_10a,pLVar6);
  }
  if ((local_109 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_108);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}